

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O0

void __thiscall
duckdb::WindowValueGlobalState::~WindowValueGlobalState(WindowValueGlobalState *this)

{
  WindowValueGlobalState *in_RDI;
  
  ~WindowValueGlobalState(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

WindowValueGlobalState(const WindowValueExecutor &executor, const idx_t payload_count,
	                       const ValidityMask &partition_mask, const ValidityMask &order_mask)
	    : WindowExecutorGlobalState(executor, payload_count, partition_mask, order_mask), ignore_nulls(&all_valid),
	      child_idx(executor.child_idx) {

		if (!executor.arg_order_idx.empty()) {
			value_tree = make_uniq<WindowIndexTree>(executor.context, executor.wexpr.arg_orders, executor.arg_order_idx,
			                                        payload_count);
		}
	}